

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string *
pugi::impl::anon_unknown_0::xpath_string::from_heap
          (xpath_string *__return_storage_ptr__,char_t *begin,char_t *end,xpath_allocator *alloc)

{
  char_t *buffer;
  char_t *data;
  size_t length;
  xpath_allocator *alloc_local;
  char_t *end_local;
  char_t *begin_local;
  
  if (end < begin) {
    __assert_fail("begin <= end",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x1e45,
                  "static xpath_string pugi::impl::(anonymous namespace)::xpath_string::from_heap(const char_t *, const char_t *, xpath_allocator *)"
                 );
  }
  if (begin == end) {
    xpath_string(__return_storage_ptr__);
  }
  else {
    buffer = duplicate_string(begin,(long)end - (long)begin,alloc);
    if (buffer == (char_t *)0x0) {
      xpath_string(__return_storage_ptr__);
    }
    else {
      xpath_string(__return_storage_ptr__,buffer,true,(long)end - (long)begin);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static xpath_string from_heap(const char_t* begin, const char_t* end, xpath_allocator* alloc)
		{
			assert(begin <= end);

			if (begin == end)
				return xpath_string();

			size_t length = static_cast<size_t>(end - begin);
			const char_t* data = duplicate_string(begin, length, alloc);

			return data ? xpath_string(data, true, length) : xpath_string();
		}